

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsKeyDown(ImGuiKey key,ImGuiID owner_id)

{
  bool bVar1;
  ImGuiKeyData *pIVar2;
  ImGuiKey in_ESI;
  ImGuiKeyData *key_data;
  ImGuiID in_stack_fffffffffffffffc;
  
  pIVar2 = GetKeyData(in_ESI);
  if ((pIVar2->Down & 1U) == 0) {
    bVar1 = false;
  }
  else {
    bVar1 = TestKeyOwner((ImGuiKey)key_data,in_stack_fffffffffffffffc);
    if (bVar1) {
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool ImGui::IsKeyDown(ImGuiKey key, ImGuiID owner_id)
{
    const ImGuiKeyData* key_data = GetKeyData(key);
    if (!key_data->Down)
        return false;
    if (!TestKeyOwner(key, owner_id))
        return false;
    return true;
}